

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

double cholmod(double *A,int N,double *L,double eps,double maxinp)

{
  int iVar1;
  int iVar2;
  double *array;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_80;
  double minljj;
  double minl2;
  double minl;
  double maxdiag;
  double maxadd;
  double *U22;
  double ls;
  int step2;
  int step;
  int k;
  int j;
  int i;
  double maxinp_local;
  double eps_local;
  double *L_local;
  int N_local;
  double *A_local;
  
  array = (double *)malloc((long)N * 8 * (long)N);
  dVar3 = sqrt(eps);
  dVar3 = sqrt(dVar3);
  maxdiag = 0.0;
  for (k = 0; k < N; k = k + 1) {
    array[k] = A[k + k * N];
  }
  for (k = 0; k < N * N; k = k + 1) {
    L[k] = 0.0;
  }
  dVar4 = array_max_abs(array,N);
  _j = maxinp;
  if ((maxinp == 0.0) && (!NAN(maxinp))) {
    _j = sqrt(dVar4);
  }
  dVar4 = sqrt(eps);
  for (step = 0; step < N; step = step + 1) {
    iVar1 = step * N;
    U22 = (double *)0x0;
    for (k = 0; k < step; k = k + 1) {
      U22 = (double *)(L[iVar1 + k] * L[iVar1 + k] + (double)U22);
    }
    L[iVar1 + step] = A[iVar1 + step] - (double)U22;
    local_80 = 0.0;
    k = step;
    while (k = k + 1, k < N) {
      U22 = (double *)0x0;
      iVar2 = k * N;
      for (step2 = 0; step2 < step; step2 = step2 + 1) {
        U22 = (double *)(L[iVar1 + step2] * L[iVar2 + step2] + (double)U22);
      }
      L[iVar2 + step] = A[iVar1 + k] - (double)U22;
      if (local_80 < ABS(L[iVar2 + step])) {
        local_80 = ABS(L[iVar2 + step]);
      }
    }
    dVar5 = dVar3 * maxinp;
    if (dVar3 * maxinp < local_80 / _j) {
      dVar5 = local_80 / _j;
    }
    local_80 = dVar5;
    if (L[iVar1 + step] <= local_80 * local_80) {
      if (local_80 < dVar4 * _j) {
        local_80 = dVar4 * _j;
      }
      if (maxdiag < local_80 * local_80 + -L[iVar1 + step]) {
        maxdiag = local_80 * local_80 + -L[iVar1 + step];
      }
      L[iVar1 + step] = local_80;
      k = step;
    }
    else {
      dVar5 = sqrt(L[iVar1 + step]);
      L[iVar1 + step] = dVar5;
      k = step;
    }
    while (k = k + 1, k < N) {
      iVar2 = k * N + step;
      L[iVar2] = L[iVar2] / L[iVar1 + step];
    }
  }
  free(array);
  return maxdiag;
}

Assistant:

double cholmod(double *A, int N, double *L, double eps,double maxinp) {
	/*
	 * Algorithm 5.5.2 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	int i,j,k,step,step2;
	double ls;
	double *U22;
	double maxadd,maxdiag,minl,minl2,minljj;
	
	U22 = (double*) malloc(sizeof(double) * N * N);
	
	minl = sqrt(sqrt(eps)) * maxinp;
	maxadd = 0.0;
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	for(i = 0; i < N * N;++i) {
		L[i] = 0.0;
	}
	
	maxdiag = array_max_abs(U22,N);
	
	if ( maxinp == 0.0) {
		maxinp = sqrt(maxdiag);
	}
	
	minl2 = sqrt(eps) * maxinp;
	
	for(j = 0; j < N;++j) {
		step = j * N;
		ls = 0.0;
		for(i = 0; i < j;++i) {
			ls += L[step+i] * L[step+i];
		}
		
		L[step+j] = A[step+j] - ls;
		minljj = 0.0;
		for(i = j+1; i < N;++i) {
			ls = 0.0;
			step2 = i * N;
			for(k = 0;k < j;++k) {
				ls += L[step+k] * L[step2+k];
			}
			L[step2+j] = A[step+i] - ls;
			
			if (fabs(L[step2+j]) > minljj) {
				minljj = fabs(L[step2+j]);
			}
		}
		
		if (minljj/maxinp > minl) {
			minljj = minljj/maxinp;
		} else {
			minljj = minl;
		}
		
		if (L[step+j] > minljj*minljj) {
				L[step+j] = sqrt(L[step+j]);
		} else {
			if (minljj < minl2) {
				minljj = minl2;
			}
			
			if (maxadd < (minljj*minljj - L[step+j])) {
				maxadd = minljj*minljj - L[step+j];
			}
			
			L[step+j] = minljj;
		}
		
		for(i = j+1; i < N;++i) {
			L[i*N+j] /= L[step+j];
		}
		
		
	}
	
	free(U22);
	
	return maxadd;
}